

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL SetCurrentDirectoryW(LPCWSTR lpPathName)

{
  SIZE_T count;
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  long in_FS_OFFSET;
  char *dir;
  size_t length;
  DWORD local_60;
  int size;
  DWORD dwLastError;
  BOOL bRet;
  LPCWSTR lpPathName_local;
  PathCharString dirPathString;
  
  dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  local_60 = 0;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPathName_local);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpPathName == (LPCWSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    local_60 = 0x7b;
    size = 0;
  }
  else {
    sVar3 = PAL_wcslen(lpPathName);
    count = sVar3 * 3 + 3;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&lpPathName_local,count);
    if (lpMultiByteStr == (char *)0x0) {
      local_60 = 8;
      size = 0;
    }
    else {
      dir._0_4_ = (int)count;
      iVar1 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,(int)dir,(LPCSTR)0x0,(LPBOOL)0x0)
      ;
      StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpPathName_local,(long)iVar1)
      ;
      if (iVar1 == 0) {
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          local_60 = 0xce;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","SetCurrentDirectoryW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                  ,0x1ed);
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
          local_60 = 0x54f;
        }
        size = 0;
      }
      else {
        size = SetCurrentDirectoryA(lpMultiByteStr);
      }
    }
  }
  if (local_60 != 0) {
    SetLastError(local_60);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPathName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != dirPathString.m_count) {
      __stack_chk_fail();
    }
    return size;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetCurrentDirectoryW(
            IN LPCWSTR lpPathName)
{
    BOOL bRet;
    DWORD dwLastError = 0;
    PathCharString dirPathString;
    int  size;
    size_t length;
    char * dir;
    
    PERF_ENTRY(SetCurrentDirectoryW);
    ENTRY("SetCurrentDirectoryW(lpPathName=%p (%S))\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING);

   /*check if the given path is null. If so
     return FALSE*/
    if (lpPathName == NULL )
    {
        ERROR("Invalid path/directory name\n");
        dwLastError = ERROR_INVALID_NAME;
        bRet = FALSE;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * 3;
    dir = dirPathString.OpenStringBuffer(length);
    if (NULL == dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        bRet = FALSE;
        goto done;
    }
    
    size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, dir, length,
                                NULL, NULL );
    dirPathString.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        bRet = FALSE;
        goto done;
    }

    bRet = SetCurrentDirectoryA(dir);
done:
    if( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("SetCurrentDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(SetCurrentDirectoryW);
    return bRet;
}